

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param_test_tests2.cpp
# Opt level: O1

void __thiscall
iu_TypeConversionParamTest_x_iutest_x_Test_Test::iu_TypeConversionParamTest_x_iutest_x_Test_Test
          (iu_TypeConversionParamTest_x_iutest_x_Test_Test *this)

{
  TestWithParam<double> *pTVar1;
  EVP_PKEY_CTX *in_RSI;
  
  (this->super_type).super_TestWithParam<double>.super_Test._vptr_Test =
       (_func_int **)&PTR__Test_003a1618;
  (this->super_type).super_TestWithParam<double>.super_Test.test_info_ = (TestInfo *)0x0;
  (this->super_type).super_TestWithParam<double>.super_Test.m_test_info = (iuITestInfoMediator *)0x0
  ;
  pTVar1 = &(this->super_type).super_TestWithParam<double>;
  (pTVar1->super_Test).m_random.m_engine.m_v3 = 0x6c078965;
  (pTVar1->super_Test).m_random.m_engine.m_v4 = 0;
  pTVar1 = &(this->super_type).super_TestWithParam<double>;
  (pTVar1->super_Test).m_random.m_engine.m_v1 = 0x2016830a;
  (pTVar1->super_Test).m_random.m_engine.m_v2 = 0x714acb3e;
  iutest::detail::iuRandom::init
            (&(this->super_type).super_TestWithParam<double>.super_Test.m_random,in_RSI);
  (this->super_type).super_TestWithParam<double>.super_Test.m_random_seed = 0;
  iutest::Test::Observer<void>::s_current = (Test *)this;
  (this->super_type).super_TestWithParam<double>.super_Test._vptr_Test =
       (_func_int **)&PTR__TestWithParam_003a5ce0;
  (this->super_type).super_TestWithParam<double>.super_WithParamInterface<double>.
  _vptr_WithParamInterface =
       (_func_int **)&PTR__iu_TypeConversionParamTest_x_iutest_x_Test_Test_003a5d20;
  return;
}

Assistant:

IUTEST_P(TypeConversionParamTest, Test)
{
}